

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall crnlib::crn_comp::optimize_color_selectors(crn_comp *this)

{
  vector<unsigned_short> *this_00;
  unsigned_short uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  unsigned_short *puVar5;
  long in_RDI;
  uint error;
  uint8 d3;
  uint8 d2;
  uint8 d1;
  uint8 d0;
  uint32 selector;
  uint16 i_3;
  uint min_error;
  uint16 selected_index;
  uint16 left;
  uint32 selected_selector;
  uint16 i_2;
  vector<unsigned_short> indices;
  vector<unsigned_int> selectors;
  uint32 i_1;
  uint8 D8 [65536];
  uint16 i;
  uint8 D4 [256];
  uint8 d [4];
  uint16 n;
  vector<unsigned_short> *remapping;
  uint in_stack_fffffffffffefdec;
  undefined6 in_stack_fffffffffffefdf0;
  unsigned_short in_stack_fffffffffffefdf6;
  undefined8 in_stack_fffffffffffefdf8;
  vector<unsigned_short> *in_stack_fffffffffffefe00;
  ushort uStack_1016e;
  uint uStack_1016c;
  ushort uStack_10168;
  ushort uStack_10166;
  uint uStack_10164;
  ushort uStack_1015e;
  vector<unsigned_short> vStack_10150;
  vector<unsigned_int> vStack_10140;
  uint uStack_1012c;
  byte abStack_10128 [168];
  vector<unsigned_short> *in_stack_fffffffffffeff80;
  vector<unsigned_char> *in_stack_fffffffffffeff88;
  crn_comp *in_stack_fffffffffffeff90;
  ushort local_11a;
  char acStack_118 [258];
  char local_16 [4];
  ushort local_12;
  vector<unsigned_short> *local_10;
  
  local_10 = (vector<unsigned_short> *)(in_RDI + 0x1f50);
  uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x1510));
  local_12 = (ushort)uVar2;
  vector<unsigned_short>::resize
            (in_stack_fffffffffffefe00,(uint)((ulong)in_stack_fffffffffffefdf8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffefdf8 >> 0x18,0));
  local_16[0] = '\0';
  local_16[1] = '\x05';
  local_16[2] = '\x0e';
  local_16[3] = '\n';
  for (local_11a = 0; local_11a < 0x100; local_11a = local_11a + 1) {
    acStack_118[local_11a] =
         local_16[(int)(((uint)local_11a ^ (int)(uint)local_11a >> 4) & 3)] +
         local_16[(int)(((int)(uint)local_11a >> 2 ^ (int)(uint)local_11a >> 6) & 3)];
  }
  for (uStack_1012c = 0; uStack_1012c < 0x10000; uStack_1012c = uStack_1012c + 1) {
    abStack_10128[uStack_1012c] =
         acStack_118[uStack_1012c >> 8 & 0xf0 | uStack_1012c >> 4 & 0xf] +
         acStack_118[uStack_1012c >> 4 & 0xf0 | uStack_1012c & 0xf];
  }
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)CONCAT26(in_stack_fffffffffffefdf6,in_stack_fffffffffffefdf0),
             in_stack_fffffffffffefdec);
  vector<unsigned_short>::vector
            ((vector<unsigned_short> *)CONCAT26(in_stack_fffffffffffefdf6,in_stack_fffffffffffefdf0)
             ,in_stack_fffffffffffefdec);
  for (uStack_1015e = 0; uStack_1015e < local_12; uStack_1015e = uStack_1015e + 1) {
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)(in_RDI + 0x1510),(uint)uStack_1015e);
    uVar3 = *puVar4;
    puVar4 = vector<unsigned_int>::operator[](&vStack_10140,(uint)uStack_1015e);
    *puVar4 = uVar3;
    puVar5 = vector<unsigned_short>::operator[](&vStack_10150,(uint)uStack_1015e);
    *puVar5 = uStack_1015e;
  }
  uStack_10164 = 0;
  uStack_10166 = local_12;
  while (uStack_10166 != 0) {
    uStack_10168 = 0;
    uStack_1016c = 0xffffffff;
    for (uStack_1016e = 0; uStack_1016e < uStack_10166; uStack_1016e = uStack_1016e + 1) {
      puVar4 = vector<unsigned_int>::operator[](&vStack_10140,(uint)uStack_1016e);
      uVar3 = *puVar4;
      uVar3 = (uint)abStack_10128[uVar3 >> 0x10 & 0xff00 | uStack_10164 >> 0x18] +
              (uint)abStack_10128[uVar3 >> 8 & 0xff00 | uStack_10164 >> 0x10 & 0xff] +
              (uint)abStack_10128[uVar3 & 0xff00 | uStack_10164 >> 8 & 0xff] +
              (uint)abStack_10128[(uVar3 & 0xff) << 8 | uStack_10164 & 0xff];
      if (uVar3 < uStack_1016c) {
        uStack_10168 = uStack_1016e;
        uStack_1016c = uVar3;
      }
    }
    puVar4 = vector<unsigned_int>::operator[](&vStack_10140,(uint)uStack_10168);
    this_00 = local_10;
    uStack_10164 = *puVar4;
    uVar1 = local_12 - uStack_10166;
    puVar5 = vector<unsigned_short>::operator[](&vStack_10150,(uint)uStack_10168);
    puVar5 = vector<unsigned_short>::operator[](this_00,(uint)*puVar5);
    *puVar5 = uVar1;
    uStack_10166 = uStack_10166 - 1;
    puVar4 = vector<unsigned_int>::operator[](&vStack_10140,(uint)uStack_10166);
    uVar3 = *puVar4;
    puVar4 = vector<unsigned_int>::operator[](&vStack_10140,(uint)uStack_10168);
    *puVar4 = uVar3;
    puVar5 = vector<unsigned_short>::operator[](&vStack_10150,(uint)uStack_10166);
    in_stack_fffffffffffefdf6 = *puVar5;
    puVar5 = vector<unsigned_short>::operator[](&vStack_10150,(uint)uStack_10168);
    *puVar5 = in_stack_fffffffffffefdf6;
  }
  pack_color_selectors
            (in_stack_fffffffffffeff90,in_stack_fffffffffffeff88,in_stack_fffffffffffeff80);
  vector<unsigned_short>::~vector
            ((vector<unsigned_short> *)CONCAT26(in_stack_fffffffffffefdf6,in_stack_fffffffffffefdf0)
            );
  vector<unsigned_int>::~vector
            ((vector<unsigned_int> *)CONCAT26(in_stack_fffffffffffefdf6,in_stack_fffffffffffefdf0));
  return;
}

Assistant:

void crn_comp::optimize_color_selectors() {
  crnlib::vector<uint16>& remapping = m_selector_remaping[cColor];
  uint16 n = m_color_selectors.size();
  remapping.resize(n);

  uint8 d[] = {0, 5, 14, 10};

  uint8 D4[0x100];
  for (uint16 i = 0; i < 0x100; i++)
    D4[i] = d[(i ^ i >> 4) & 3] + d[(i >> 2 ^ i >> 6) & 3];
  uint8 D8[0x10000];
  for (uint32 i = 0; i < 0x10000; i++)
    D8[i] = D4[(i >> 8 & 0xF0) | (i >> 4 & 0xF)] + D4[(i >> 4 & 0xF0) | (i & 0xF)];

  crnlib::vector<uint32> selectors(n);
  crnlib::vector<uint16> indices(n);
  for (uint16 i = 0; i < n; i++) {
    selectors[i] = m_color_selectors[i];
    indices[i] = i;
  }
  uint32 selected_selector = 0;
  for (uint16 left = n; left;) {
    uint16 selected_index = 0;
    uint min_error = cUINT32_MAX;
    for (uint16 i = 0; i < left; i++) {
      uint32 selector = selectors[i];
      uint8 d0 = D8[(selector >> 16 & 0xFF00) | (selected_selector >> 24 & 0xFF)];
      uint8 d1 = D8[(selector >> 8 & 0xFF00) | (selected_selector >> 16 & 0xFF)];
      uint8 d2 = D8[(selector & 0xFF00) | (selected_selector >> 8 & 0xFF)];
      uint8 d3 = D8[(selector << 8 & 0xFF00) | (selected_selector & 0xFF)];
      uint error = d0 + d1 + d2 + d3;
      if (error < min_error) {
        min_error = error;
        selected_index = i;
      }
    }
    selected_selector = selectors[selected_index];
    remapping[indices[selected_index]] = n - left;
    left--;
    selectors[selected_index] = selectors[left];
    indices[selected_index] = indices[left];
  }

  pack_color_selectors(m_packed_color_selectors, remapping);
}